

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this_00;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)allocate(this,0x30,8);
  slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }